

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void freeexps(FuncState *fs,expdesc *e1,expdesc *e2)

{
  int local_30;
  int local_2c;
  int r2;
  int r1;
  expdesc *e2_local;
  expdesc *e1_local;
  FuncState *fs_local;
  
  if (e1->k == VNONRELOC) {
    local_2c = (e1->u).info;
  }
  else {
    local_2c = -1;
  }
  if (e2->k == VNONRELOC) {
    local_30 = (e2->u).info;
  }
  else {
    local_30 = -1;
  }
  if (local_30 < local_2c) {
    freereg(fs,local_2c);
    freereg(fs,local_30);
  }
  else {
    freereg(fs,local_30);
    freereg(fs,local_2c);
  }
  return;
}

Assistant:

static void freeexps (FuncState *fs, expdesc *e1, expdesc *e2) {
  int r1 = (e1->k == VNONRELOC) ? e1->u.info : -1;
  int r2 = (e2->k == VNONRELOC) ? e2->u.info : -1;
  if (r1 > r2) {
    freereg(fs, r1);
    freereg(fs, r2);
  }
  else {
    freereg(fs, r2);
    freereg(fs, r1);
  }
}